

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fspec.cc
# Opt level: O3

void __thiscall
ParamListStandard::forceNoUse(ParamListStandard *this,ParamActive *active,int4 start,int4 stop)

{
  ParamEntry *pPVar1;
  long lVar2;
  pointer pPVar3;
  int4 i;
  int iVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  
  if (start < stop) {
    pPVar3 = (active->trial).super__Vector_base<ParamTrial,_std::allocator<ParamTrial>_>._M_impl.
             super__Vector_impl_data._M_start + start;
    lVar2 = (long)stop - (long)start;
    iVar4 = -1;
    bVar7 = false;
    uVar5 = 0;
    do {
      pPVar1 = pPVar3->entry;
      uVar6 = uVar5;
      if (pPVar1 != (ParamEntry *)0x0) {
        if ((iVar4 < pPVar1->group) || (pPVar1->alignment != 0)) {
          uVar8 = pPVar3->flags;
          uVar6 = uVar8 >> 2 & 0x3f;
          iVar4 = pPVar1->groupsize + pPVar1->group + -1;
          if ((uVar5 & 1) != 0 || bVar7) goto LAB_0025697b;
        }
        else {
          uVar8 = pPVar3->flags;
          if ((uVar8 & 4) == 0) {
            uVar5 = 0;
          }
          uVar6 = uVar5;
          if (bVar7) {
LAB_0025697b:
            pPVar3->flags = (uVar8 & 0xfffffff6) + 1;
            bVar7 = true;
            goto LAB_00256988;
          }
        }
        bVar7 = false;
      }
LAB_00256988:
      pPVar3 = pPVar3 + 1;
      lVar2 = lVar2 + -1;
      uVar5 = uVar6;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

void ParamListStandard::forceNoUse(ParamActive *active, int4 start, int4 stop) const

{
  bool seendefnouse = false;
  int4 curgroup = -1;
  bool exclusion = false;
  bool alldefnouse = false;
  for (int4 i = start; i < stop; ++i) {
    ParamTrial &curtrial(active->getTrial(i));
    if (curtrial.getEntry() == (const ParamEntry *) 0)
      continue;	// Already marked as not used
    int4 grp = curtrial.getEntry()->getGroup();
    exclusion = curtrial.getEntry()->isExclusion();
    if ((grp <= curgroup) && exclusion) {// If in the same exclusion group
      if (!curtrial.isDefinitelyNotUsed()) // A single element that might be used
	alldefnouse = false; // means that the whole group might be used
    }
    else { // First trial in a new group (or next element in same non-exclusion group)
      if (alldefnouse)	   // If all in the last group were defnotused
	seendefnouse = true;// then force everything afterword to be defnotused
      alldefnouse = curtrial.isDefinitelyNotUsed();
      curgroup = grp + curtrial.getEntry()->getGroupSize() - 1;
    }
    if (seendefnouse)
      curtrial.markInactive();
  }
}